

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_stream_syslog.c
# Opt level: O0

int log_policy_stream_syslog_create(log_policy policy,log_policy_ctor ctor)

{
  undefined8 *instance;
  undefined8 *in_RSI;
  log_policy in_RDI;
  log_policy_stream_syslog_ctor syslog_ctor;
  log_policy_stream_syslog_data syslog_data;
  undefined4 local_4;
  
  instance = (undefined8 *)malloc(8);
  if (instance != (undefined8 *)0x0) {
    *instance = *in_RSI;
    openlog((char *)*instance,0xb,8);
    log_policy_instantiate(in_RDI,instance,4);
  }
  local_4 = (uint)(instance == (undefined8 *)0x0);
  return local_4;
}

Assistant:

static int log_policy_stream_syslog_create(log_policy policy, const log_policy_ctor ctor)
{
	log_policy_stream_syslog_data syslog_data = malloc(sizeof(struct log_policy_stream_syslog_data_type));

	const log_policy_stream_syslog_ctor syslog_ctor = ctor;

	if (syslog_data == NULL)
	{
		return 1;
	}

	syslog_data->name = syslog_ctor->name;

#if defined(_WIN32)
	syslog_data->handle = RegisterEventSource(NULL, syslog_data->name);
#elif defined(linux) || defined(__linux__) || defined(__linux) || defined(__gnu_linux) || \
	defined(__FreeBSD__) || \
	(defined(__APPLE__) && defined(__MACH__)) || defined(__MACOSX__)
	openlog(syslog_data->name, LOG_CONS | LOG_PID | LOG_NDELAY, LOG_USER);
#endif

	log_policy_instantiate(policy, syslog_data, LOG_POLICY_STREAM_SYSLOG);

	return 0;
}